

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microfacet.hpp
# Opt level: O3

vec3f __thiscall schuttejoe::GgxVndf(schuttejoe *this,vec3f wo,float roughness,float u1,float u2)

{
  double dVar1;
  double dVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  double dVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  vec3f vVar15;
  
  fVar7 = wo.z;
  fVar11 = -fVar7;
  if (-fVar7 <= fVar7) {
    fVar11 = fVar7;
  }
  fVar6 = wo.x * roughness;
  fVar3 = wo.y * roughness;
  fVar10 = 1.0 / SQRT(fVar11 * fVar11 + fVar6 * fVar6 + fVar3 * fVar3);
  fVar3 = fVar3 * fVar10;
  fVar11 = fVar10 * fVar11;
  fVar10 = fVar10 * fVar6;
  if (0.999 <= fVar3) {
    fVar13 = 1.0;
    fVar6 = 0.0;
    fVar12 = 0.0;
  }
  else {
    fVar12 = fVar3 * -0.0 + fVar10;
    fVar13 = fVar3 * 0.0 + -fVar11;
    fVar14 = fVar11 * 0.0 + fVar10 * -0.0;
    fVar6 = 1.0 / SQRT(fVar12 * fVar12 + fVar13 * fVar13 + fVar14 * fVar14);
    fVar12 = fVar12 * fVar6;
    fVar13 = fVar6 * fVar13;
    fVar6 = fVar6 * fVar14;
  }
  fVar14 = 1.0 / (fVar11 + 1.0);
  if (u1 < 0.0) {
    fVar4 = sqrtf(u1);
  }
  else {
    fVar4 = SQRT(u1);
  }
  if (fVar14 <= u2) {
    fVar14 = ((u2 - fVar14) / (1.0 - fVar14)) * PI + PI;
    dVar9 = (double)fVar11;
  }
  else {
    fVar14 = (u2 / fVar14) * PI;
    dVar9 = 1.0;
  }
  dVar1 = cos((double)fVar14);
  dVar2 = sin((double)fVar14);
  fVar5 = (float)((double)fVar4 * dVar1);
  fVar4 = (float)(dVar2 * (double)fVar4 * dVar9);
  fVar14 = (1.0 - fVar5 * fVar5) - fVar4 * fVar4;
  if (fVar14 <= 0.0) {
    fVar14 = 0.0;
  }
  fVar14 = SQRT(fVar14);
  dVar9 = (double)(fVar11 * fVar14 + (fVar13 * fVar3 - fVar10 * fVar6) * fVar4 + fVar12 * fVar5);
  if (dVar9 <= 0.0) {
    dVar9 = 0.0;
  }
  if (fVar7 < 0.0) {
    dVar9 = -dVar9;
  }
  fVar8 = (float)dVar9;
  fVar7 = roughness * (fVar14 * fVar10 + (fVar6 * fVar11 - fVar3 * fVar12) * fVar4 + fVar5 * fVar13)
  ;
  fVar3 = roughness * (fVar14 * fVar3 + (fVar12 * fVar10 - fVar11 * fVar13) * fVar4 + fVar5 * fVar6)
  ;
  fVar11 = 1.0 / SQRT(fVar8 * fVar8 + fVar7 * fVar7 + fVar3 * fVar3);
  vVar15.x = fVar11 * fVar7;
  vVar15.y = fVar11 * fVar3;
  vVar15.z = fVar11 * fVar8;
  return vVar15;
}

Assistant:

vec3f GgxVndf(vec3f wo, float roughness, float u1, float u2)
{
    float ttt = 1;
    if (wo.z < 0) {
        wo.z = -wo.z;
        ttt = -1;
    }
    // -- Stretch the view vector so we are sampling as though
    // -- roughness==1
    vec3f v = normalized(vec3f(wo.x * roughness,
                                wo.y * roughness,
                                wo.z ));

    // -- Build an orthonormal basis with v, t1, and t2
    vec3f t1 = (v.y < 0.999f) ? normalized(cross(v, vec3f(0,1,0))) : vec3f(1,0,0);
    vec3f t2 = cross(t1, v);

    // -- Choose a point on a disk with each half of the disk weighted
    // -- proportionally to its projection onto direction v
    float a = 1.0f / (1.0f + v.z);
    float r = sqrtf(u1);
    float phi = (u2 < a) ? (u2 / a) * PI 
                         : PI + (u2 - a) / (1.0f - a) * PI;
    float p1 = r * cos(phi);
    float p2 = r * sin(phi) * ((u2 < a) ? 1.0f : v.z);

    // -- Calculate the normal in this stretched tangent space
    vec3f n = p1 * t1 + p2 * t2
             + sqrtf(fmax(0.0f, 1.0f - p1 * p1 - p2 * p2)) * v;

    // -- unstretch and normalize the normal
    return normalized(vec3f(roughness * n.x,
                            roughness * n.y,
                            fmax(0.0f, n.z) * ttt));
}